

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis.cpp
# Opt level: O0

SENode * __thiscall
spvtools::opt::ScalarEvolutionAnalysis::CreateSubtraction
          (ScalarEvolutionAnalysis *this,SENode *operand_1,SENode *operand_2)

{
  int iVar1;
  undefined4 extraout_var;
  int64_t iVar2;
  undefined4 extraout_var_00;
  int64_t iVar3;
  SENode *pSVar4;
  SENode *operand_2_local;
  SENode *operand_1_local;
  ScalarEvolutionAnalysis *this_local;
  
  iVar1 = (**operand_1->_vptr_SENode)();
  if ((iVar1 == 0) && (iVar1 = (**operand_2->_vptr_SENode)(), iVar1 == 0)) {
    iVar1 = (*operand_1->_vptr_SENode[4])();
    iVar2 = SEConstantNode::FoldToSingleValue((SEConstantNode *)CONCAT44(extraout_var,iVar1));
    iVar1 = (*operand_2->_vptr_SENode[4])();
    iVar3 = SEConstantNode::FoldToSingleValue((SEConstantNode *)CONCAT44(extraout_var_00,iVar1));
    pSVar4 = CreateConstant(this,iVar2 - iVar3);
    return pSVar4;
  }
  pSVar4 = CreateNegation(this,operand_2);
  pSVar4 = CreateAddNode(this,operand_1,pSVar4);
  return pSVar4;
}

Assistant:

SENode* ScalarEvolutionAnalysis::CreateSubtraction(SENode* operand_1,
                                                   SENode* operand_2) {
  // Fold if both operands are constant.
  if (operand_1->GetType() == SENode::Constant &&
      operand_2->GetType() == SENode::Constant) {
    return CreateConstant(operand_1->AsSEConstantNode()->FoldToSingleValue() -
                          operand_2->AsSEConstantNode()->FoldToSingleValue());
  }

  return CreateAddNode(operand_1, CreateNegation(operand_2));
}